

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessing.c
# Opt level: O1

void expand_macro(token *macro_name,Source_File *src,Translation_Data *translation_data)

{
  void *pvVar1;
  Queue *args;
  int *piVar2;
  token *ptVar3;
  undefined8 *puVar4;
  
  if (macro_name->type == KW_ID) {
    pvVar1 = Map_Check(translation_data->macros,macro_name->data,macro_name->data_size);
  }
  else {
    pvVar1 = (void *)0x0;
  }
  if (pvVar1 != (void *)0x0) {
    free(macro_name);
    args = make_define_argument_list(*(size_t *)((long)pvVar1 + 0x18));
    load_macro_arguments(args,*(size_t *)((long)pvVar1 + 0x18),src,translation_data);
    if (translation_data->errors->size == 0) {
      for (puVar4 = (undefined8 *)**(undefined8 **)((long)pvVar1 + 8); puVar4 != (undefined8 *)0x0;
          puVar4 = (undefined8 *)puVar4[1]) {
        ptVar3 = (token *)*puVar4;
        piVar2 = (int *)Map_Check(*(Map **)((long)pvVar1 + 0x10),ptVar3->data,ptVar3->data_size);
        if (piVar2 == (int *)0x0) {
          ptVar3 = copy_token(ptVar3);
          ptVar3->line = src->which_row;
          ptVar3->column = src->which_column;
          Queue_Push(translation_data->tokens,ptVar3);
        }
        else {
          expand_macro_argument(args + *piVar2,src,translation_data);
        }
      }
    }
    delete_define_argument_list(*(size_t *)((long)pvVar1 + 0x18),args);
    return;
  }
  Queue_Push(translation_data->tokens,macro_name);
  return;
}

Assistant:

void expand_macro(struct token* macro_name,struct Source_File *src,struct Translation_Data *translation_data)
{
	struct define_directive *hold=NULL;
	struct token *hold_token;
	int *index;
	struct Queue_Node *it;
	struct Queue *argument_list;

	if(macro_name->type==KW_ID)
		hold=Map_Check(translation_data->macros,macro_name->data,macro_name->data_size);
	if(hold!=NULL)
	{
		free(macro_name);
		argument_list=make_define_argument_list(hold->number_of_arguments);
		load_macro_arguments(argument_list,hold->number_of_arguments,src,translation_data);
		if(translation_data->errors->size>0)
		{
			delete_define_argument_list(hold->number_of_arguments,argument_list);
			return;
		}

		
		for(it=hold->macro_tokens->first;it!=NULL;it=it->prev)
		{
			hold_token=(struct token*)it->data;
			index=Map_Check(hold->arguments,hold_token->data,hold_token->data_size);
			if(index!=NULL)
			{
				expand_macro_argument(argument_list+*index,src,translation_data);
			}else
			{
				hold_token=copy_token(hold_token);

				hold_token->line=src->which_row;
				hold_token->column=src->which_column;

				Queue_Push(translation_data->tokens,hold_token);
			}
		}
		delete_define_argument_list(hold->number_of_arguments,argument_list);
	}else
	{
		/*this isn't a macro, so we just push it to the token queue*/
		Queue_Push(translation_data->tokens,macro_name);
	}
}